

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

ON_ClippingPlaneData * GetClippingPlaneData(uint sn)

{
  bool bVar1;
  long lVar2;
  ON_ClippingPlaneData *pOVar3;
  
  if (sn == 0) {
    pOVar3 = (ON_ClippingPlaneData *)0x0;
  }
  else {
    bVar1 = ON_SleepLock::GetLock(&g_data_list_lock);
    if (0 < (long)g_data_list.m_list.m_count) {
      lVar2 = 0;
      do {
        pOVar3 = g_data_list.m_list.m_a[lVar2];
        if ((pOVar3 != (ON_ClippingPlaneData *)0x0) && (pOVar3->m_sn == sn)) goto LAB_0056c418;
        lVar2 = lVar2 + 1;
      } while (g_data_list.m_list.m_count != lVar2);
    }
    pOVar3 = (ON_ClippingPlaneData *)0x0;
LAB_0056c418:
    if (bVar1) {
      ON_SleepLock::ReturnLock(&g_data_list_lock);
    }
  }
  return pOVar3;
}

Assistant:

static ON_ClippingPlaneData* GetClippingPlaneData(unsigned int sn)
{
  if (0==sn)
    return nullptr;
  
  bool bReturnLock = g_data_list_lock.GetLock();
  ON_ClippingPlaneData* rc = g_data_list.FromSerialNumber(sn);
  if(bReturnLock)
    g_data_list_lock.ReturnLock();
  return rc;
}